

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check.h
# Opt level: O0

void __thiscall
mp::
SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::GenerateViolationsReport
          (SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,SolCheck *chk,bool param_3)

{
  bool bVar1;
  SolCheck *in_RSI;
  MemoryWriter wrt;
  size_type in_stack_fffffffffffffc38;
  SolCheck *in_stack_fffffffffffffc40;
  allocator<char> *in_stack_fffffffffffffc58;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_fffffffffffffc60;
  reference in_stack_fffffffffffffc70;
  BasicWriter<char> *in_stack_fffffffffffffc78;
  reference in_stack_fffffffffffffc80;
  string local_340 [16];
  string *in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcdf;
  MemoryWriter *in_stack_fffffffffffffce0;
  ViolSummary *in_stack_fffffffffffffce8;
  SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffffcf0;
  allocator<char> local_2f1;
  string local_2f0 [39];
  undefined1 local_2c9 [40];
  allocator<char> local_2a1;
  string local_2a0 [39];
  allocator<char> local_279;
  string local_278 [55];
  allocator<char> local_241 [125];
  int in_stack_fffffffffffffe3c;
  MemoryWriter *in_stack_fffffffffffffe40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
  *in_stack_fffffffffffffe48;
  SolutionChecker<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffffe50;
  
  std::allocator<char>::allocator();
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
            (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  std::allocator<char>::~allocator(local_241);
  bVar1 = SolCheck::HasAnyConViols(in_stack_fffffffffffffc40);
  if (bVar1) {
    SolCheck::VarViolBnds(in_RSI);
    std::array<mp::ViolSummary,_2UL>::at
              ((array<mp::ViolSummary,_2UL> *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
               (allocator<char> *)in_stack_fffffffffffffc70);
    Gen1Viol(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
             (bool)in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd0);
    std::__cxx11::string::~string(local_278);
    std::allocator<char>::~allocator(&local_279);
    SolCheck::VarViolBnds(in_RSI);
    std::array<mp::ViolSummary,_2UL>::at
              ((array<mp::ViolSummary,_2UL> *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
               (allocator<char> *)in_stack_fffffffffffffc70);
    Gen1Viol(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
             (bool)in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd0);
    std::__cxx11::string::~string(local_2a0);
    std::allocator<char>::~allocator(&local_2a1);
    SolCheck::VarViolIntty(in_RSI);
    in_stack_fffffffffffffc80 =
         std::array<mp::ViolSummary,_2UL>::at
                   ((array<mp::ViolSummary,_2UL> *)in_stack_fffffffffffffc40,
                    in_stack_fffffffffffffc38);
    in_stack_fffffffffffffc78 = (BasicWriter<char> *)local_2c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
               (allocator<char> *)in_stack_fffffffffffffc70);
    Gen1Viol(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
             (bool)in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd0);
    std::__cxx11::string::~string((string *)(local_2c9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_2c9);
    SolCheck::VarViolIntty(in_RSI);
    in_stack_fffffffffffffc70 =
         std::array<mp::ViolSummary,_2UL>::at
                   ((array<mp::ViolSummary,_2UL> *)in_stack_fffffffffffffc40,
                    in_stack_fffffffffffffc38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
               (allocator<char> *)in_stack_fffffffffffffc70);
    Gen1Viol(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
             (bool)in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd0);
    std::__cxx11::string::~string(local_2f0);
    std::allocator<char>::~allocator(&local_2f1);
  }
  SolCheck::ConViolAlg_abi_cxx11_(in_RSI);
  GenConViol(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe3c);
  SolCheck::ConViolLog_abi_cxx11_(in_RSI);
  GenConViol(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe3c);
  bVar1 = SolCheck::HasAnyObjViols(in_RSI);
  if (bVar1) {
    in_stack_fffffffffffffc40 = (SolCheck *)SolCheck::ObjViols(in_RSI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
               (allocator<char> *)in_stack_fffffffffffffc70);
    Gen1Viol(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
             (bool)in_stack_fffffffffffffcdf,in_stack_fffffffffffffcd0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffce8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffce7);
  }
  fmt::BasicWriter<char>::str_abi_cxx11_(in_stack_fffffffffffffc78);
  SolCheck::SetReport(in_stack_fffffffffffffc40,(string *)in_RSI);
  std::__cxx11::string::~string(local_340);
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter
            ((BasicMemoryWriter<char,_std::allocator<char>_> *)in_stack_fffffffffffffc40);
  return;
}

Assistant:

void GenerateViolationsReport(
      SolCheck& chk, bool ) {
    fmt::MemoryWriter wrt;
    if (chk.HasAnyConViols()) {
      Gen1Viol(chk.VarViolBnds().at(0), wrt, true,
               "variable bounds");
      Gen1Viol(chk.VarViolBnds().at(1), wrt, true,
               "aux var bounds");
      Gen1Viol(chk.VarViolIntty().at(0), wrt, true,
               "variable integrality");
      Gen1Viol(chk.VarViolIntty().at(1), wrt, true,
               "aux var integrality");
    }
    GenConViol(chk.ConViolAlg(), wrt, 0);
    GenConViol(chk.ConViolLog(), wrt, 1);
    if (chk.HasAnyObjViols()) {
      Gen1Viol(chk.ObjViols(), wrt, true,
               "objective(s)");
    }
    chk.SetReport( wrt.str() );
  }